

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

ssize_t ossl_send(Curl_cfilter *cf,Curl_easy *data,void *mem,size_t len,CURLcode *curlcode)

{
  void *pvVar1;
  long lVar2;
  CURLcode CVar3;
  uint uVar4;
  int err;
  char *pcVar5;
  uint *puVar6;
  ulong uVar7;
  size_t sVar8;
  char error_buffer [256];
  
  pvVar1 = cf->ctx;
  lVar2 = *(long *)((long)pvVar1 + 0x30);
  ERR_clear_error();
  *(undefined4 *)((long)pvVar1 + 0xb4) = 0;
  sVar8 = 0x7fffffff;
  if (len < 0x7fffffff) {
    sVar8 = len;
  }
  uVar4 = SSL_write(*(SSL **)(lVar2 + 8),mem,(int)sVar8);
  if ((int)uVar4 < 1) {
    err = SSL_get_error(*(SSL **)(lVar2 + 8),uVar4);
    switch(err) {
    case 1:
      uVar7 = ERR_get_error();
      pcVar5 = ossl_strerror(uVar7,error_buffer,0x100);
      Curl_failf(data,"SSL_write() error: %s",pcVar5);
      break;
    case 2:
      *(undefined4 *)((long)pvVar1 + 0xb4) = 1;
    case 3:
      *curlcode = CURLE_AGAIN;
      return -1;
    default:
      pcVar5 = SSL_ERROR_to_str(err);
      puVar6 = (uint *)__errno_location();
      Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",pcVar5,(ulong)*puVar6);
      break;
    case 5:
      puVar6 = (uint *)__errno_location();
      if (*(int *)(lVar2 + 0x20) == 0x51) {
        CVar3 = CURLE_AGAIN;
      }
      else {
        uVar4 = *puVar6;
        uVar7 = ERR_get_error();
        if (uVar7 == 0) {
          if (uVar4 == 0) {
            curl_msnprintf(error_buffer,0x100,"%s","SSL_ERROR_SYSCALL");
          }
          else {
            Curl_strerror(uVar4,error_buffer,0x100);
          }
        }
        else {
          ossl_strerror(uVar7,error_buffer,0x100);
        }
        Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",error_buffer,(ulong)uVar4);
        CVar3 = CURLE_SEND_ERROR;
      }
      *curlcode = CVar3;
      return -1;
    }
    *curlcode = CURLE_SEND_ERROR;
    return -1;
  }
  *curlcode = CURLE_OK;
  return (ulong)uVar4;
}

Assistant:

static ssize_t ossl_send(struct Curl_cfilter *cf,
                         struct Curl_easy *data,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256];
  sslerr_t sslerror;
  int memlen;
  int rc;
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;

  (void)data;
  DEBUGASSERT(octx);

  ERR_clear_error();

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  rc = SSL_write(octx->ssl, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(octx->ssl, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
      connssl->io_need = CURL_SSL_IO_NEED_RECV;
      *curlcode = CURLE_AGAIN;
      rc = -1;
      goto out;
    case SSL_ERROR_WANT_WRITE:
      *curlcode = CURLE_AGAIN;
      rc = -1;
      goto out;
    case SSL_ERROR_SYSCALL:
    {
      int sockerr = SOCKERRNO;

      if(octx->io_result == CURLE_AGAIN) {
        *curlcode = CURLE_AGAIN;
        rc = -1;
        goto out;
      }
      sslerror = ERR_get_error();
      if(sslerror)
        ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
      else if(sockerr)
        Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
      else
        msnprintf(error_buffer, sizeof(error_buffer), "%s",
                  SSL_ERROR_to_str(err));

      failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
            error_buffer, sockerr);
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
    case SSL_ERROR_SSL: {
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      failf(data, "SSL_write() error: %s",
            ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
    default:
      /* a true error */
      failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
            SSL_ERROR_to_str(err), SOCKERRNO);
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
  }
  *curlcode = CURLE_OK;

out:
  return (ssize_t)rc; /* number of bytes */
}